

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3tokBestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  sqlite3_index_constraint *psVar1;
  sqlite3_index_constraint_usage *psVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)pInfo->nConstraint;
  if (pInfo->nConstraint < 1) {
    uVar4 = uVar3;
  }
  lVar5 = 5;
  while( true ) {
    if (uVar4 == uVar3) {
      pInfo->idxNum = 0;
      return 0;
    }
    psVar1 = pInfo->aConstraint;
    if (((*(char *)((long)&psVar1->iColumn + lVar5) != '\0') &&
        (*(int *)((long)psVar1 + lVar5 + -5) == 0)) &&
       (*(char *)((long)psVar1 + lVar5 + -1) == '\x02')) break;
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0xc;
  }
  pInfo->idxNum = 1;
  psVar2 = pInfo->aConstraintUsage;
  psVar2[uVar3].argvIndex = 1;
  psVar2[uVar3].omit = '\x01';
  pInfo->estimatedCost = 1.0;
  return 0;
}

Assistant:

static int fts3tokBestIndexMethod(
  sqlite3_vtab *pVTab,
  sqlite3_index_info *pInfo
){
  int i;
  UNUSED_PARAMETER(pVTab);

  for(i=0; i<pInfo->nConstraint; i++){
    if( pInfo->aConstraint[i].usable
     && pInfo->aConstraint[i].iColumn==0
     && pInfo->aConstraint[i].op==SQLITE_INDEX_CONSTRAINT_EQ
    ){
      pInfo->idxNum = 1;
      pInfo->aConstraintUsage[i].argvIndex = 1;
      pInfo->aConstraintUsage[i].omit = 1;
      pInfo->estimatedCost = 1;
      return SQLITE_OK;
    }
  }

  pInfo->idxNum = 0;
  assert( pInfo->estimatedCost>1000000.0 );

  return SQLITE_OK;
}